

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

unique_ptr<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>_> __thiscall
wallet::SQLiteBatch::GetNewPrefixCursor(SQLiteBatch *this,Span<const_std::byte> prefix)

{
  wallet *pwVar1;
  _func_int *p_Var2;
  _func_int *p_Var3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  runtime_error *this_00;
  long in_RCX;
  _func_int **args;
  byte *__first;
  char *pcVar7;
  string *in_R9;
  long in_FS_OFFSET;
  Span<const_std::byte> blob;
  Span<const_std::byte> blob_00;
  undefined8 local_90;
  undefined1 local_88 [8];
  vector<std::byte,_std::allocator<std::byte>_> end_range;
  vector<std::byte,_std::allocator<std::byte>_> start_range;
  string local_50;
  long local_30;
  
  __first = (byte *)prefix.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(undefined8 *)(prefix.m_data + 8) + 200) == 0) {
    (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
  }
  else {
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&start_range,__first,__first + in_RCX,
               (allocator_type *)&local_50);
    std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&end_range,__first,__first + in_RCX,
               (allocator_type *)&local_50);
    pbVar6 = end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pbVar6 != end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start) {
      if (pbVar6[-1] != 0xff) {
        pbVar6[-1] = pbVar6[-1] + 1;
        break;
      }
      pbVar6 = pbVar6 + -1;
      *pbVar6 = 0;
    }
    if ((pbVar6 == end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start) &&
       (end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    std::
    make_unique<wallet::SQLiteCursor,std::vector<std::byte,std::allocator<std::byte>>&,std::vector<std::byte,std::allocator<std::byte>>&>
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_88,&start_range);
    if (local_88 == (undefined1  [8])0x0) {
      (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
    }
    else {
      pcVar7 = "SELECT key, value FROM main WHERE key >= ? AND key < ?";
      if (end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start ==
          end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pcVar7 = "SELECT key, value FROM main WHERE key >= ?";
      }
      args = (_func_int **)((long)local_88 + 8);
      iVar5 = sqlite3_prepare_v2(*(undefined8 *)(*(undefined8 *)(prefix.m_data + 8) + 200),pcVar7,
                                 0xffffffffffffffff,args,0);
      if (iVar5 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_90 = sqlite3_errstr(iVar5);
        tinyformat::format<char_const*>
                  (&local_50,
                   (tinyformat *)"SQLiteDatabase: Failed to setup cursor SQL statement: %s\n",
                   (char *)&local_90,(char **)args);
        std::runtime_error::runtime_error(this_00,(string *)&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_004a7770;
      }
      pwVar1 = *(wallet **)((long)local_88 + 8);
      p_Var2 = *(_func_int **)((long)local_88 + 0x10);
      p_Var3 = *(_func_int **)((long)local_88 + 0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"prefix_start",(allocator<char> *)&local_90);
      blob.m_size = (size_t)&local_50;
      blob.m_data = (byte *)(p_Var3 + -(long)p_Var2);
      bVar4 = BindBlobToStatement(pwVar1,(sqlite3_stmt *)&DAT_00000001,(int)p_Var2,blob,in_R9);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) {
        if (end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start !=
            end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pwVar1 = *(wallet **)((long)local_88 + 8);
          p_Var2 = *(_func_int **)((long)local_88 + 0x28);
          p_Var3 = *(_func_int **)((long)local_88 + 0x30);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"prefix_end",(allocator<char> *)&local_90);
          blob_00.m_size = (size_t)&local_50;
          blob_00.m_data = (byte *)(p_Var3 + -(long)p_Var2);
          bVar4 = BindBlobToStatement(pwVar1,(sqlite3_stmt *)0x2,(int)p_Var2,blob_00,in_R9);
          std::__cxx11::string::~string((string *)&local_50);
          if (!bVar4) goto LAB_004a7614;
        }
        (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)local_88;
      }
      else {
LAB_004a7614:
        (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)0x0;
        if (local_88 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_88 + 8))();
        }
      }
    }
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&end_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&start_range.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
            )(__uniq_ptr_data<wallet::DatabaseCursor,_std::default_delete<wallet::DatabaseCursor>,_true,_true>
              )this;
  }
LAB_004a7770:
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<DatabaseCursor> SQLiteBatch::GetNewPrefixCursor(Span<const std::byte> prefix)
{
    if (!m_database.m_db) return nullptr;

    // To get just the records we want, the SQL statement does a comparison of the binary data
    // where the data must be greater than or equal to the prefix, and less than
    // the prefix incremented by one (when interpreted as an integer)
    std::vector<std::byte> start_range(prefix.begin(), prefix.end());
    std::vector<std::byte> end_range(prefix.begin(), prefix.end());
    auto it = end_range.rbegin();
    for (; it != end_range.rend(); ++it) {
        if (*it == std::byte(std::numeric_limits<unsigned char>::max())) {
            *it = std::byte(0);
            continue;
        }
        *it = std::byte(std::to_integer<unsigned char>(*it) + 1);
        break;
    }
    if (it == end_range.rend()) {
        // If the prefix is all 0xff bytes, clear end_range as we won't need it
        end_range.clear();
    }

    auto cursor = std::make_unique<SQLiteCursor>(start_range, end_range);
    if (!cursor) return nullptr;

    const char* stmt_text = end_range.empty() ? "SELECT key, value FROM main WHERE key >= ?" :
                            "SELECT key, value FROM main WHERE key >= ? AND key < ?";
    int res = sqlite3_prepare_v2(m_database.m_db, stmt_text, -1, &cursor->m_cursor_stmt, nullptr);
    if (res != SQLITE_OK) {
        throw std::runtime_error(strprintf(
            "SQLiteDatabase: Failed to setup cursor SQL statement: %s\n", sqlite3_errstr(res)));
    }

    if (!BindBlobToStatement(cursor->m_cursor_stmt, 1, cursor->m_prefix_range_start, "prefix_start")) return nullptr;
    if (!end_range.empty()) {
        if (!BindBlobToStatement(cursor->m_cursor_stmt, 2, cursor->m_prefix_range_end, "prefix_end")) return nullptr;
    }

    return cursor;
}